

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O0

int AF_A_FSwordFlames(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool local_8e;
  bool local_8b;
  DVector3 local_88;
  FName local_6c;
  double local_68;
  double zo;
  double yo;
  double xo;
  void *pvStack_48;
  int i;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_8b = true;
    if (stateowner != (AActor *)0x0) {
      local_8b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_8b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                    ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_8e = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_8e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_8e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                      ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      pvStack_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      pvStack_48 = (void *)0x0;
    }
    uVar1 = FRandom::operator()(&pr_fswordflame);
    for (xo._4_4_ = (uVar1 & 3) + 1; xo._4_4_ != 0; xo._4_4_ = xo._4_4_ + -1) {
      iVar2 = FRandom::operator()(&pr_fswordflame);
      yo = (double)(iVar2 + -0x80) / 16.0;
      iVar2 = FRandom::operator()(&pr_fswordflame);
      zo = (double)(iVar2 + -0x80) / 16.0;
      iVar2 = FRandom::operator()(&pr_fswordflame);
      local_68 = (double)(iVar2 + -0x80) / 8.0;
      FName::FName(&local_6c,"FSwordFlame");
      AActor::Vec3Offset(&local_88,stateowner,yo,zo,local_68,false);
      Spawn(&local_6c,&local_88,ALLOW_REPLACE);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FSwordFlames)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	for (i = 1+(pr_fswordflame()&3); i; i--)
	{
		double xo = (pr_fswordflame() - 128) / 16.;
		double yo = (pr_fswordflame() - 128) / 16.;
		double zo = (pr_fswordflame() - 128) / 8.;
		Spawn ("FSwordFlame", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
	}
	return 0;
}